

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O2

ClassBuilder * __thiscall
Lodtalk::ClassBuilder::setSuperclass(ClassBuilder *this,Class *superClass,Metaclass *metaSuper)

{
  Ref<Lodtalk::Class> *this_00;
  Ref<Lodtalk::Metaclass> *this_01;
  Class *pCVar1;
  Metaclass *pMVar2;
  
  this_00 = &this->clazz;
  pCVar1 = Ref<Lodtalk::Class>::operator->(this_00);
  (pCVar1->super_ClassDescription).super_Behavior.superclass = (Behavior *)superClass;
  if (superClass == (Class *)&NilObject) {
    pCVar1 = Ref<Lodtalk::Class>::operator->(this_00);
    (pCVar1->super_ClassDescription).super_Behavior.format.field_0.uintValue = 1;
    pCVar1 = Ref<Lodtalk::Class>::operator->(this_00);
    (pCVar1->super_ClassDescription).super_Behavior.fixedVariableCount.field_0.uintValue = 1;
  }
  else {
    pCVar1 = Ref<Lodtalk::Class>::operator->(this_00);
    (pCVar1->super_ClassDescription).super_Behavior.format.field_0 =
         (superClass->super_ClassDescription).super_Behavior.format.field_0;
    pCVar1 = Ref<Lodtalk::Class>::operator->(this_00);
    (pCVar1->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 =
         (superClass->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
  }
  this_01 = &this->metaclass;
  pMVar2 = Ref<Lodtalk::Metaclass>::operator->(this_01);
  (pMVar2->super_ClassDescription).super_Behavior.superclass = (Behavior *)metaSuper;
  pMVar2 = Ref<Lodtalk::Metaclass>::operator->(this_01);
  (pMVar2->super_ClassDescription).super_Behavior.format.field_0 =
       (metaSuper->super_ClassDescription).super_Behavior.format.field_0;
  pMVar2 = Ref<Lodtalk::Metaclass>::operator->(this_01);
  (pMVar2->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 =
       (metaSuper->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
  if (superClass == (Class *)&NilObject) {
    pMVar2 = Ref<Lodtalk::Metaclass>::operator->(this_01);
    (pMVar2->super_ClassDescription).super_Behavior.format.field_0.uintValue = 3;
    pMVar2 = Ref<Lodtalk::Metaclass>::operator->(this_01);
    (pMVar2->super_ClassDescription).super_Behavior.fixedVariableCount.field_0.uintValue = 0x1f;
  }
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::setSuperclass(Class *superClass, Metaclass *metaSuper)
{
    // Copy the format from the super class
    clazz->superclass = superClass;
    if(!isNil(superClass))
    {
        clazz->format = superClass->format;
        clazz->fixedVariableCount = superClass->fixedVariableCount;
    }
    else
    {
        clazz->format = Oop::encodeSmallInteger(OF_EMPTY);
        clazz->fixedVariableCount = Oop::encodeSmallInteger(0);
    }

    // Set the meta class super class.
    metaclass->superclass = metaSuper;

    // Set the meta class format and fixed size
    metaclass->format = metaSuper->format;
    metaclass->fixedVariableCount = metaSuper->fixedVariableCount;
    if(isNil(superClass))
    {
        metaclass->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
        metaclass->fixedVariableCount = Oop::encodeSmallInteger(Class::ClassVariableCount);
    }

    return *this;
}